

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

void __thiscall QDebug::QDebug(QDebug *this,QByteArray *bytes)

{
  Stream *this_00;
  
  this_00 = (Stream *)operator_new(0x58);
  ::QTextStream::QTextStream((QTextStream *)this_00,bytes,(OpenMode)0x2);
  (this_00->buffer).d.d = (Data *)0x0;
  (this_00->buffer).d.ptr = (char16_t *)0x0;
  (this_00->buffer).d.size = 0;
  this_00->ref = 1;
  this_00->type = QtDebugMsg;
  this_00->space = true;
  this_00->noQuotes = false;
  this_00->message_output = false;
  this_00->verbosity = 2;
  (this_00->context).version = 2;
  *(undefined8 *)&(this_00->context).line = 0;
  *(undefined8 *)((long)&(this_00->context).file + 4) = 0;
  (this_00->context).function = (char *)0x0;
  (this_00->context).category = (char *)0x0;
  this->stream = this_00;
  return;
}

Assistant:

explicit QDebug(QByteArray *bytes) : stream(new Stream(bytes)) {}